

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveEnumType
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          Enum *enum_type)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  Rep *pRVar4;
  StringPiece error_message;
  undefined8 uVar5;
  SourceContext *pSVar6;
  EnumValue *pEVar7;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_00;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_01;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_02;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_03;
  RepeatedPtrField<google::protobuf::Option> *pRVar8;
  long lVar9;
  Arena *pAVar10;
  ArenaStringPtr *this_00;
  long lVar11;
  undefined1 local_b0 [8];
  Status status;
  size_t local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  string type_name;
  
  local_68 = (undefined1  [8])&type_name._M_string_length;
  type_name._M_dataplus._M_p = (pointer)0x0;
  type_name._M_string_length._0_1_ = 0;
  ParseTypeUrl((Status *)local_b0,this,type_url,(string *)local_68);
  if (local_b0._0_4_ == OK) {
    uVar5 = DescriptorPool::FindEnumTypeByName(this->pool_,(string *)local_68);
    if ((EnumDescriptor *)uVar5 == (EnumDescriptor *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&status.error_message_.field_2 + 8),"Invalid type URL, unknown type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      error_message.length_ = local_80;
      error_message.ptr_ = (char *)status.error_message_.field_2._8_8_;
      if ((long)local_80 < 0) {
        StringPiece::LogFatalSizeTooBig(local_80,"size_t to int conversion");
      }
      Status::Status(__return_storage_ptr__,NOT_FOUND,error_message);
      if ((undefined1 *)status.error_message_.field_2._8_8_ != local_78) {
        operator_delete((void *)status.error_message_.field_2._8_8_);
      }
    }
    else {
      Enum::Clear(enum_type);
      pAVar10 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      psVar2 = (enum_type->name_).ptr_;
      if (psVar2 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (&enum_type->name_,pAVar10,*(string **)(uVar5 + 8));
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar2);
      }
      if (enum_type->source_context_ == (SourceContext *)0x0) {
        pAVar10 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        pSVar6 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar10);
        enum_type->source_context_ = pSVar6;
      }
      pAVar10 = (Arena *)(enum_type->source_context_->super_Message).super_MessageLite.
                         _internal_metadata_.ptr_;
      this_00 = &enum_type->source_context_->file_name_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      psVar2 = this_00->ptr_;
      if (psVar2 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (this_00,pAVar10,(string *)**(undefined8 **)(uVar5 + 0x10));
        pRVar8 = extraout_RDX_00;
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar2);
        pRVar8 = extraout_RDX;
      }
      if (0 < *(int *)(uVar5 + 0x2c)) {
        lVar9 = 0x20;
        lVar11 = 0;
        type_name.field_2._8_8_ = uVar5;
        do {
          lVar3 = *(long *)(type_name.field_2._8_8_ + 0x30);
          pRVar4 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_0033aa57:
            protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&(enum_type->enumvalue_).super_RepeatedPtrFieldBase,
                       (enum_type->enumvalue_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0033aa66:
            pRVar4 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            pEVar7 = Arena::CreateMaybeMessage<google::protobuf::EnumValue>
                               ((enum_type->enumvalue_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.rep_;
            iVar1 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_;
            (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            pRVar4->elements[iVar1] = pEVar7;
          }
          else {
            iVar1 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar1) {
              if (pRVar4->allocated_size ==
                  (enum_type->enumvalue_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0033aa57;
              goto LAB_0033aa66;
            }
            (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            pEVar7 = (EnumValue *)pRVar4->elements[iVar1];
          }
          pAVar10 = (Arena *)(pEVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          psVar2 = (pEVar7->name_).ptr_;
          if (psVar2 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            protobuf::internal::ArenaStringPtr::CreateInstance
                      (&pEVar7->name_,pAVar10,*(string **)(lVar3 + -0x20 + lVar9));
            pRVar8 = extraout_RDX_02;
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar2);
            pRVar8 = extraout_RDX_01;
          }
          pEVar7->number_ = *(int32 *)(lVar3 + -0x10 + lVar9);
          ConvertOptionsInternal
                    (*(DescriptorPoolTypeResolver **)(lVar3 + lVar9),(Message *)&pEVar7->options_,
                     pRVar8);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x28;
          pRVar8 = extraout_RDX_03;
          uVar5 = type_name.field_2._8_8_;
        } while (lVar11 < *(int *)(type_name.field_2._8_8_ + 0x2c));
      }
      ConvertOptionsInternal
                (*(DescriptorPoolTypeResolver **)(uVar5 + 0x20),(Message *)&enum_type->options_,
                 pRVar8);
      Status::Status(__return_storage_ptr__);
    }
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_b0);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  if (local_68 != (undefined1  [8])&type_name._M_string_length) {
    operator_delete((void *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ResolveEnumType(const std::string& type_url,
                         Enum* enum_type) override {
    std::string type_name;
    Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const EnumDescriptor* descriptor = pool_->FindEnumTypeByName(type_name);
    if (descriptor == NULL) {
      return Status(util::error::NOT_FOUND,
                    "Invalid type URL, unknown type: " + type_name);
    }
    ConvertEnumDescriptor(descriptor, enum_type);
    return Status();
  }